

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_fload_3(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  Value operand;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  operand = Frame::getLocalVariableValue(this_01,3);
  if (operand.type == FLOAT) {
    Frame::pushIntoOperandStack(this_01,operand);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value.type == ValueType::FLOAT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x31c,"void ExecutionEngine::i_fload_3()");
}

Assistant:

void ExecutionEngine::i_fload_3() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value = topFrame->getLocalVariableValue(3);
    assert(value.type == ValueType::FLOAT);
    topFrame->pushIntoOperandStack(value);

    topFrame->pc += 1;
}